

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::MergeFrom(ExtensionSet *this,ExtensionSet *other)

{
  ushort uVar1;
  LargeMap *pLVar2;
  KeyValue *pKVar3;
  KeyValue *pKVar4;
  KeyValue *pKVar5;
  KeyValue *pKVar6;
  long lVar7;
  _Base_ptr p_Var8;
  difference_type dVar9;
  long lVar10;
  size_t minimum_new_capacity;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_> it;
  
  if (0x100 < this->flat_capacity_) {
LAB_00147f1b:
    if (other->flat_capacity_ < 0x101) {
      pKVar3 = flat_begin(other);
      pKVar4 = flat_end(other);
      for (; pKVar3 != pKVar4; pKVar3 = pKVar3 + 1) {
        InternalExtensionMergeFrom(this,pKVar3->first,&pKVar3->second);
      }
    }
    else {
      pLVar2 = (other->map_).large;
      for (p_Var8 = (pLVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &(pLVar2->_M_t)._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        InternalExtensionMergeFrom(this,p_Var8[1]._M_color,(Extension *)&p_Var8[1]._M_parent);
      }
    }
    return;
  }
  uVar1 = other->flat_capacity_;
  pKVar3 = flat_begin(this);
  pKVar4 = flat_end(this);
  if (0x100 < uVar1) {
    pLVar2 = (other->map_).large;
    p_Var8 = (pLVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    lVar7 = 0;
    do {
      lVar7 = -lVar7;
      lVar10 = (long)pKVar4 - (long)pKVar3;
      while( true ) {
        if ((pKVar3 == pKVar4) ||
           ((_Rb_tree_header *)p_Var8 == &(pLVar2->_M_t)._M_impl.super__Rb_tree_header)) {
          dVar9 = std::
                  __distance<std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                            ();
          minimum_new_capacity = (dVar9 + (lVar10 >> 5)) - lVar7;
          goto LAB_00147f13;
        }
        if ((int)p_Var8[1]._M_color <= pKVar3->first) break;
        pKVar3 = pKVar3 + 1;
        lVar7 = lVar7 + -1;
        lVar10 = lVar10 + -0x20;
      }
      lVar7 = 1 - lVar7;
      if (pKVar3->first == p_Var8[1]._M_color) {
        pKVar3 = pKVar3 + 1;
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while( true );
  }
  pKVar5 = flat_begin(other);
  pKVar6 = flat_end(other);
  lVar7 = 0;
LAB_00147ebc:
  lVar10 = (long)pKVar4 - (long)pKVar3;
  lVar7 = -lVar7;
  do {
    if ((pKVar3 == pKVar4) || (pKVar5 == pKVar6)) {
      minimum_new_capacity = (((long)pKVar6 - (long)pKVar5 >> 5) + (lVar10 >> 5)) - lVar7;
LAB_00147f13:
      GrowCapacity(this,minimum_new_capacity);
      goto LAB_00147f1b;
    }
    if (pKVar5->first <= pKVar3->first) break;
    pKVar3 = pKVar3 + 1;
    lVar10 = lVar10 + -0x20;
    lVar7 = lVar7 + -1;
  } while( true );
  if (pKVar3->first == pKVar5->first) {
    pKVar3 = pKVar3 + 1;
  }
  pKVar5 = pKVar5 + 1;
  lVar7 = 1 - lVar7;
  goto LAB_00147ebc;
}

Assistant:

void ExtensionSet::MergeFrom(const ExtensionSet& other) {
  if (PROTOBUF_PREDICT_TRUE(!is_large())) {
    if (PROTOBUF_PREDICT_TRUE(!other.is_large())) {
      GrowCapacity(SizeOfUnion(flat_begin(), flat_end(), other.flat_begin(),
                               other.flat_end()));
    } else {
      GrowCapacity(SizeOfUnion(flat_begin(), flat_end(),
                               other.map_.large->begin(),
                               other.map_.large->end()));
    }
  }
  other.ForEach([this](int number, const Extension& ext) {
    this->InternalExtensionMergeFrom(number, ext);
  });
}